

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDeclarations
          (MessageGenerator *this,Printer *printer)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  iterator __first;
  iterator __last;
  OneofDescriptor *pOVar4;
  FieldOptions *this_00;
  reference ppFVar5;
  FieldGenerator *pFVar6;
  MessageOptions *this_01;
  string *psVar7;
  FieldDescriptor *field_00;
  Iterator IVar8;
  Iterator IVar9;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  undefined1 local_290 [8];
  SaveState saver;
  value_type oneof;
  Iterator __end3_2;
  Iterator __begin3_2;
  OneOfRangeImpl *__range3_2;
  char *local_218;
  char *local_210;
  undefined1 local_208 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  SaveState save_1;
  FieldDescriptor *field_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3_1;
  undefined1 local_160 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  SaveState save;
  FieldDescriptor *field_1;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_88;
  const_iterator local_80;
  undefined1 local_68 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  Formatter::Formatter
            ((Formatter *)
             &ordered_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,printer,&this->variables_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_68);
  iVar3 = Descriptor::field_count(this->descriptor_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_68,(long)iVar3);
  local_88._M_current =
       (FieldDescriptor **)
       std::
       vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_68);
  __gnu_cxx::
  __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
  ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
            ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
              *)&local_80,&local_88);
  __first = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::begin(&this->optimized_order_);
  __last = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::end(&this->optimized_order_);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)local_68,local_80,
             (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              )__last._M_current);
  __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
  IVar8 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar8.descriptor;
  __end3.descriptor._0_4_ = IVar8.idx;
  IVar8 = FieldRangeImpl<google::protobuf::Descriptor>::end
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar8.descriptor;
  field._0_4_ = IVar8.idx;
  do {
    bVar2 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field);
    if (!bVar2) {
      bVar2 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::empty((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_68);
      if (!bVar2) {
        Formatter::operator()<>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"enum : int {\n");
        __end4 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)local_68);
        field_1 = (FieldDescriptor *)
                  std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)local_68);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                           *)&field_1), bVar2) {
          ppFVar5 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end4);
          save.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppFVar5;
          Formatter::SaveState::SaveState
                    ((SaveState *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Formatter *)
                     &ordered_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_160);
          SetCommonFieldVariables
                    ((FieldDescriptor *)save.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_160,&this->options_);
          Formatter::AddMap((Formatter *)
                            &ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_160);
          FieldConstantName_abi_cxx11_
                    ((string *)&__range3_1,
                     (cpp *)save.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,field_00);
          Formatter::operator()
                    ((Formatter *)
                     &ordered_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "  ${1$$2$$}$ = $number$,\n",
                     (FieldDescriptor **)
                     &save.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range3_1);
          std::__cxx11::string::~string((string *)&__range3_1);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_160);
          Formatter::SaveState::~SaveState
                    ((SaveState *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end4);
        }
        Formatter::operator()<>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"};\n");
      }
      __end3_1 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)local_68);
      field_2 = (FieldDescriptor *)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_68);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                 *)&field_2), bVar2) {
        ppFVar5 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&__end3_1);
        save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppFVar5;
        PrintFieldComment<google::protobuf::FieldDescriptor>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (FieldDescriptor *)save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        Formatter::SaveState::SaveState
                  ((SaveState *)&vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_208);
        SetCommonFieldVariables
                  ((FieldDescriptor *)save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_208,&this->options_);
        Formatter::AddMap((Formatter *)
                          &ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_208);
        bVar2 = FieldDescriptor::is_repeated
                          ((FieldDescriptor *)
                           save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (bVar2) {
          bVar2 = IsFieldStripped((FieldDescriptor *)
                                  save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  &this->options_);
          local_210 = ";";
          if (bVar2) {
            local_210 = " {__builtin_trap();}";
          }
          Formatter::operator()
                    ((Formatter *)
                     &ordered_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "$deprecated_attr$int ${1$$name$_size$}$() const$2$\n",
                     (FieldDescriptor **)
                     &save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_210);
          bVar2 = IsFieldStripped((FieldDescriptor *)
                                  save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  &this->options_);
          if (!bVar2) {
            Formatter::operator()
                      ((Formatter *)
                       &ordered_fields.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "private:\nint ${1$_internal_$name$_size$}$() const;\npublic:\n",
                       (FieldDescriptor **)
                       &save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
        }
        else {
          bVar2 = anon_unknown_0::HasHasMethod
                            ((FieldDescriptor *)
                             save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (bVar2) {
            bVar2 = IsFieldStripped((FieldDescriptor *)
                                    save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    &this->options_);
            local_218 = ";";
            if (bVar2) {
              local_218 = " {__builtin_trap();}";
            }
            Formatter::operator()
                      ((Formatter *)
                       &ordered_fields.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "$deprecated_attr$bool ${1$has_$name$$}$() const$2$\n",
                       (FieldDescriptor **)
                       &save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_218);
            bVar2 = IsFieldStripped((FieldDescriptor *)
                                    save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    &this->options_);
            if (!bVar2) {
              Formatter::operator()<>
                        ((Formatter *)
                         &ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "private:\nbool _internal_has_$name$() const;\npublic:\n");
            }
          }
          else {
            bVar2 = anon_unknown_0::HasPrivateHasMethod
                              ((FieldDescriptor *)
                               save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if ((bVar2) &&
               (bVar2 = IsFieldStripped((FieldDescriptor *)
                                        save_1.vars_._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,&this->options_), !bVar2)) {
              Formatter::operator()
                        ((Formatter *)
                         &ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "private:\nbool ${1$_internal_has_$name$$}$() const;\npublic:\n",
                         (FieldDescriptor **)
                         &save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
          }
        }
        bVar2 = IsFieldStripped((FieldDescriptor *)
                                save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                &this->options_);
        pcVar1 = "\';";
        if (bVar2) {
          pcVar1 = " {__builtin_trap();}";
        }
        __range3_2 = (OneOfRangeImpl *)(pcVar1 + 1);
        Formatter::operator()
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "$deprecated_attr$void ${1$clear_$name$$}$()$2$\n",
                   (FieldDescriptor **)
                   &save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (char **)&__range3_2);
        pFVar6 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)
                            save_1.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*pFVar6->_vptr_FieldGenerator[5])(pFVar6,printer);
        Formatter::operator()<>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_208);
        Formatter::SaveState::~SaveState
                  ((SaveState *)&vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end3_1);
      }
      iVar3 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar3) {
        Formatter::operator()<>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "\ntemplate <typename _proto_TypeTraits,\n          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,\n          bool _is_packed>\ninline bool HasExtension(\n    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<\n        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {\n$annotate_extension_has$\n  return _extensions_.Has(id.number());\n}\n\ntemplate <typename _proto_TypeTraits,\n          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,\n          bool _is_packed>\ninline void ClearExtension(\n    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<\n        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {\n  _extensions_.ClearExtension(id.number());\n$annotate_extension_clear$\n}\n\ntemplate <typename _proto_TypeTraits,\n          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,\n          bool _is_packed>\ninline int ExtensionSize(\n    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<\n        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {\n$annotate_extension_repeated_size$\n  return _extensions_.ExtensionSize(id.number());\n}\n\ntemplate <typename _proto_TypeTraits,\n          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,\n          bool _is_packed>\ninline typename _proto_TypeTraits::Singular::ConstType GetExtension(\n    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<\n        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {\n$annotate_extension_get$\n  return _proto_TypeTraits::Get(id.number(), _extensions_,\n                                id.default_value());\n}\n\ntemplate <typename _proto_TypeTraits,\n          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,\n          bool _is_packed>\ninline typename _proto_TypeTraits::Singular::MutableType MutableExtension(\n    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<\n        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {\n$annotate_extension_mutable$\n  return _proto_TypeTraits::Mutable(id.number(), _f..." /* TRUNCATED STRING LITERAL */
                  );
        this_01 = Descriptor::options(this->descriptor_);
        bVar2 = MessageOptions::message_set_wire_format(this_01);
        if (((bVar2) && (((this->options_).opensource_runtime & 1U) == 0)) &&
           (((this->options_).lite_implicit_weak_fields & 1U) == 0)) {
          Formatter::operator()<>
                    ((Formatter *)
                     &ordered_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "GOOGLE_PROTOBUF_EXTENSION_MESSAGE_SET_ACCESSORS($classname$)\n");
        }
      }
      __begin3_2.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
      IVar9 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_2.descriptor);
      __begin3_2._0_8_ = IVar9.descriptor;
      __end3_2.descriptor._0_4_ = IVar9.idx;
      IVar9 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_2.descriptor);
      __end3_2._0_8_ = IVar9.descriptor;
      oneof._0_4_ = IVar9.idx;
      while (bVar2 = cpp::operator!=((Iterator *)&__end3_2.descriptor,(Iterator *)&oneof), bVar2) {
        saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_2.descriptor);
        Formatter::SaveState::SaveState
                  ((SaveState *)local_290,
                   (Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b0,"oneof_name",&local_2b1);
        psVar7 = OneofDescriptor::name_abi_cxx11_
                           ((OneofDescriptor *)
                            saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b0,psVar7);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2d8,"camel_oneof_name",&local_2d9);
        psVar7 = OneofDescriptor::name_abi_cxx11_
                           ((OneofDescriptor *)
                            saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        UnderscoresToCamelCase(&local_300,psVar7,true);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8,&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        Formatter::operator()
                  ((Formatter *)
                   &ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "void ${1$clear_$oneof_name$$}$();\n$camel_oneof_name$Case $oneof_name$_case() const;\n"
                   ,(OneofDescriptor **)
                    &saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Formatter::SaveState::~SaveState((SaveState *)local_290);
        OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_2.descriptor);
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_68);
      Formatter::~Formatter
                ((Formatter *)
                 &ordered_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    __range4 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                            ((Iterator *)&__end3.descriptor);
    pOVar4 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)__range4);
    if (pOVar4 == (OneofDescriptor *)0x0) {
      this_00 = FieldDescriptor::options((FieldDescriptor *)__range4);
      bVar2 = FieldOptions::weak(this_00);
      if ((bVar2) || (bVar2 = IsFieldStripped((FieldDescriptor *)__range4,&this->options_), bVar2))
      goto LAB_00513210;
    }
    else {
LAB_00513210:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_68,(value_type *)&__range4);
    }
    FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  } while( true );
}

Assistant:

void MessageGenerator::GenerateFieldAccessorDeclarations(io::Printer* printer) {
  Formatter format(printer, variables_);
  // optimized_fields_ does not contain fields where
  //    field->real_containing_oneof()
  // so we need to iterate over those as well.
  //
  // We place the non-oneof fields in optimized_order_, as that controls the
  // order of the _has_bits_ entries and we want GDB's pretty printers to be
  // able to infer these indices from the k[FIELDNAME]FieldNumber order.
  std::vector<const FieldDescriptor*> ordered_fields;
  ordered_fields.reserve(descriptor_->field_count());

  ordered_fields.insert(ordered_fields.begin(), optimized_order_.begin(),
                        optimized_order_.end());
  for (auto field : FieldRange(descriptor_)) {
    if (!field->real_containing_oneof() && !field->options().weak() &&
        !IsFieldStripped(field, options_)) {
      continue;
    }
    ordered_fields.push_back(field);
  }

  if (!ordered_fields.empty()) {
    format("enum : int {\n");
    for (auto field : ordered_fields) {
      Formatter::SaveState save(&format);

      std::map<std::string, std::string> vars;
      SetCommonFieldVariables(field, &vars, options_);
      format.AddMap(vars);
      format("  ${1$$2$$}$ = $number$,\n", field, FieldConstantName(field));
    }
    format("};\n");
  }
  for (auto field : ordered_fields) {
    PrintFieldComment(format, field);

    Formatter::SaveState save(&format);

    std::map<std::string, std::string> vars;
    SetCommonFieldVariables(field, &vars, options_);
    format.AddMap(vars);

    if (field->is_repeated()) {
      format("$deprecated_attr$int ${1$$name$_size$}$() const$2$\n", field,
             !IsFieldStripped(field, options_) ? ";" : " {__builtin_trap();}");
      if (!IsFieldStripped(field, options_)) {
        format(
            "private:\n"
            "int ${1$_internal_$name$_size$}$() const;\n"
            "public:\n",
            field);
      }
    } else if (HasHasMethod(field)) {
      format("$deprecated_attr$bool ${1$has_$name$$}$() const$2$\n", field,
             !IsFieldStripped(field, options_) ? ";" : " {__builtin_trap();}");
      if (!IsFieldStripped(field, options_)) {
        format(
            "private:\n"
            "bool _internal_has_$name$() const;\n"
            "public:\n");
      }
    } else if (HasPrivateHasMethod(field)) {
      if (!IsFieldStripped(field, options_)) {
        format(
            "private:\n"
            "bool ${1$_internal_has_$name$$}$() const;\n"
            "public:\n",
            field);
      }
    }
    format("$deprecated_attr$void ${1$clear_$name$$}$()$2$\n", field,
           !IsFieldStripped(field, options_) ? ";" : "{__builtin_trap();}");

    // Generate type-specific accessor declarations.
    field_generators_.get(field).GenerateAccessorDeclarations(printer);

    format("\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    // Generate accessors for extensions.
    // We use "_proto_TypeTraits" as a type name below because "TypeTraits"
    // causes problems if the class has a nested message or enum type with that
    // name and "_TypeTraits" is technically reserved for the C++ library since
    // it starts with an underscore followed by a capital letter.
    //
    // For similar reason, we use "_field_type" and "_is_packed" as parameter
    // names below, so that "field_type" and "is_packed" can be used as field
    // names.
    format(R"(
template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline bool HasExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {
$annotate_extension_has$
  return _extensions_.Has(id.number());
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline void ClearExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {
  _extensions_.ClearExtension(id.number());
$annotate_extension_clear$
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline int ExtensionSize(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {
$annotate_extension_repeated_size$
  return _extensions_.ExtensionSize(id.number());
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Singular::ConstType GetExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {
$annotate_extension_get$
  return _proto_TypeTraits::Get(id.number(), _extensions_,
                                id.default_value());
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Singular::MutableType MutableExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {
$annotate_extension_mutable$
  return _proto_TypeTraits::Mutable(id.number(), _field_type,
                                    &_extensions_);
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline void SetExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    typename _proto_TypeTraits::Singular::ConstType value) {
  _proto_TypeTraits::Set(id.number(), _field_type, value, &_extensions_);
$annotate_extension_set$
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline void SetAllocatedExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    typename _proto_TypeTraits::Singular::MutableType value) {
  _proto_TypeTraits::SetAllocated(id.number(), _field_type, value,
                                  &_extensions_);
$annotate_extension_set$
}
template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline void UnsafeArenaSetAllocatedExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    typename _proto_TypeTraits::Singular::MutableType value) {
  _proto_TypeTraits::UnsafeArenaSetAllocated(id.number(), _field_type,
                                             value, &_extensions_);
$annotate_extension_set$
}
template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
PROTOBUF_NODISCARD inline
    typename _proto_TypeTraits::Singular::MutableType
    ReleaseExtension(
        const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
            $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {
$annotate_extension_release$
  return _proto_TypeTraits::Release(id.number(), _field_type,
                                    &_extensions_);
}
template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Singular::MutableType
UnsafeArenaReleaseExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {
$annotate_extension_release$
  return _proto_TypeTraits::UnsafeArenaRelease(id.number(), _field_type,
                                               &_extensions_);
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Repeated::ConstType GetExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    int index) const {
$annotate_repeated_extension_get$
  return _proto_TypeTraits::Get(id.number(), _extensions_, index);
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Repeated::MutableType MutableExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    int index) {
$annotate_repeated_extension_mutable$
  return _proto_TypeTraits::Mutable(id.number(), index, &_extensions_);
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline void SetExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    int index, typename _proto_TypeTraits::Repeated::ConstType value) {
  _proto_TypeTraits::Set(id.number(), index, value, &_extensions_);
$annotate_repeated_extension_set$
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Repeated::MutableType AddExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {
  typename _proto_TypeTraits::Repeated::MutableType to_add =
      _proto_TypeTraits::Add(id.number(), _field_type, &_extensions_);
$annotate_repeated_extension_add_mutable$
  return to_add;
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline void AddExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id,
    typename _proto_TypeTraits::Repeated::ConstType value) {
  _proto_TypeTraits::Add(id.number(), _field_type, _is_packed, value,
                         &_extensions_);
$annotate_repeated_extension_add$
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline const typename _proto_TypeTraits::Repeated::RepeatedFieldType&
GetRepeatedExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) const {
$annotate_repeated_extension_list$
  return _proto_TypeTraits::GetRepeated(id.number(), _extensions_);
}

template <typename _proto_TypeTraits,
          ::PROTOBUF_NAMESPACE_ID::internal::FieldType _field_type,
          bool _is_packed>
inline typename _proto_TypeTraits::Repeated::RepeatedFieldType*
MutableRepeatedExtension(
    const ::PROTOBUF_NAMESPACE_ID::internal::ExtensionIdentifier<
        $classname$, _proto_TypeTraits, _field_type, _is_packed>& id) {
$annotate_repeated_extension_list_mutable$
  return _proto_TypeTraits::MutableRepeated(id.number(), _field_type,
                                            _is_packed, &_extensions_);
}

)");
    // Generate MessageSet specific APIs for proto2 MessageSet.
    // For testing purposes we don't check for bridge.MessageSet, so
    // we don't use IsProto2MessageSet
    if (descriptor_->options().message_set_wire_format() &&
        !options_.opensource_runtime && !options_.lite_implicit_weak_fields) {
      // Special-case MessageSet
      format("GOOGLE_PROTOBUF_EXTENSION_MESSAGE_SET_ACCESSORS($classname$)\n");
    }
  }

  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter::SaveState saver(&format);
    format.Set("oneof_name", oneof->name());
    format.Set("camel_oneof_name", UnderscoresToCamelCase(oneof->name(), true));
    format(
        "void ${1$clear_$oneof_name$$}$();\n"
        "$camel_oneof_name$Case $oneof_name$_case() const;\n",
        oneof);
  }
}